

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O1

Vector<double,_2> __thiscall tcu::normalize<double,2>(tcu *this,Vector<double,_2> *a)

{
  int i;
  long lVar1;
  double sqSum;
  double dVar2;
  Vector<double,_2> VVar3;
  
  dVar2 = 0.0;
  lVar1 = 0;
  do {
    dVar2 = dVar2 + a->m_data[lVar1] * a->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  if (dVar2 < 0.0) {
    dVar2 = ::sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  VVar3.m_data[1] = 1.0 / dVar2;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar1 = 0;
  do {
    VVar3.m_data[0] = a->m_data[lVar1] * VVar3.m_data[1];
    *(double *)(this + lVar1 * 8) = VVar3.m_data[0];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return (Vector<double,_2>)VVar3.m_data;
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}